

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::InternalSwap
          (PoolingLayerParams *this,PoolingLayerParams *other)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  PoolingPaddingTypeUnion PVar4;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->kernelsize_,&other->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->stride_,&other->stride_);
  iVar2 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar2;
  bVar1 = this->avgpoolexcludepadding_;
  this->avgpoolexcludepadding_ = other->avgpoolexcludepadding_;
  other->avgpoolexcludepadding_ = bVar1;
  bVar1 = this->globalpooling_;
  this->globalpooling_ = other->globalpooling_;
  other->globalpooling_ = bVar1;
  PVar4 = this->PoolingPaddingType_;
  this->PoolingPaddingType_ = other->PoolingPaddingType_;
  other->PoolingPaddingType_ = PVar4;
  uVar3 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar3;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void PoolingLayerParams::InternalSwap(PoolingLayerParams* other) {
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  std::swap(type_, other->type_);
  std::swap(avgpoolexcludepadding_, other->avgpoolexcludepadding_);
  std::swap(globalpooling_, other->globalpooling_);
  std::swap(PoolingPaddingType_, other->PoolingPaddingType_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}